

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# excl.c
# Opt level: O3

void nn_excl_term(nn_excl *self)

{
  nn_pipe *in_RSI;
  
  if (self->pipe == (nn_pipe *)0x0) {
    if (self->inpipe == (nn_pipe *)0x0) {
      if (self->outpipe == (nn_pipe *)0x0) {
        return;
      }
      goto LAB_00123ba8;
    }
  }
  else {
    nn_excl_term_cold_1();
  }
  nn_excl_term_cold_2();
LAB_00123ba8:
  nn_excl_term_cold_3();
  if (self->pipe != (nn_pipe *)0x0) {
    return;
  }
  self->pipe = in_RSI;
  return;
}

Assistant:

void nn_excl_term (struct nn_excl *self)
{
    nn_assert (!self->pipe);
    nn_assert (!self->inpipe);
    nn_assert (!self->outpipe);
}